

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O1

state_status_t
tchecker::ta::final(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
                   sync_id_t *sync_id,clock_constraint_container_t *invariant,
                   final_value_t *final_value)

{
  stored_size_type sVar1;
  iterator iVar2;
  integer_iterator_t<int> *piVar3;
  make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *pmVar4;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar5;
  state_status_t sVar6;
  integer_t iVar7;
  bytecode_t *bytecode;
  runtime_error *this;
  char *__function;
  ulong uVar8;
  long lVar9;
  long lVar10;
  integer_iterator_t<int> *piVar11;
  
  sVar6 = syncprod::final(&system->super_system_t,vloc,vedge,sync_id,
                          &(final_value->
                           super__Tuple_impl<0UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
                           ).
                           super__Head_base<0UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_false>
                           ._M_head_impl);
  if (sVar6 == 1) {
    sVar1 = *(stored_size_type *)
             ((long)&(system->super_system_t).super_system_t.super_intvars_t._integer_variables.
                     super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._flattened_variables.
                     super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             + 8);
    if (sVar1 != *(stored_size_type *)
                  ((long)&(system->super_system_t).super_system_t.super_intvars_t._integer_variables
                          .
                          super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._flattened_variables.
                          super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 0x20)) {
      __assert_fail("_key_map.size() == _value_map.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                    ,0x90,
                    "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
                   );
    }
    iVar2._M_current =
         (final_value->
         super__Tuple_impl<0UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
         ).
         super__Tuple_impl<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
         .
         super__Head_base<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>,_false>
         ._M_head_impl._begin._it._M_current;
    piVar3 = (final_value->
             super__Tuple_impl<0UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
             ).
             super__Tuple_impl<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
             .
             super__Head_base<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>,_false>
             ._M_head_impl._end._it._M_current;
    if (iVar2._M_current != piVar3) {
      pmVar4 = intval->_t;
      lVar9 = 0;
      lVar10 = 0;
      do {
        if ((int)sVar1 == (int)lVar10) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,"tchecker::ta::final: valuation of incompatible size");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (pmVar4 == (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)0x0)
        goto LAB_00179050;
        if ((pmVar4->super_intval_t).super_integer_array_t.super_intval_base_t.
            super_array_capacity_t<unsigned_short>._capacity <= (ushort)lVar10) {
          __assert_fail("i < BASE::_capacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                        ,0xf1,
                        "T &tchecker::make_array_t<int, 4, tchecker::intval_base_t>::operator[](typename BASE::capacity_t) [T = int, T_ALLOCSIZE = 4, BASE = tchecker::intval_base_t]"
                       );
        }
        (&(pmVar4->super_intval_t).super_integer_array_t._fam)[lVar10] =
             *(no_storage_array_t<int> *)(iVar2._M_current + lVar10);
        lVar10 = lVar10 + 1;
        piVar11 = (integer_iterator_t<int> *)((long)(iVar2._M_current + 1) + lVar9);
        lVar9 = lVar9 + 4;
      } while (piVar11 != piVar3);
    }
    pmVar5 = vloc->_t;
    if (pmVar5 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
      __function = 
      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
      ;
      goto LAB_00179065;
    }
    uVar8 = (ulong)(pmVar5->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                   super_array_capacity_t<unsigned_int>._capacity;
    sVar6 = 1;
    if (uVar8 != 0) {
      lVar9 = 0;
      do {
        bytecode = system_t::invariant_bytecode
                             (system,*(loc_id_t *)
                                      (&(pmVar5->super_vloc_t).super_loc_array_t._fam.field_0x0 +
                                      lVar9));
        if (&intval->_t->super_intval_t == (intval_t *)0x0) goto LAB_00179050;
        iVar7 = vm_t::run(&system->_vm,bytecode,&intval->_t->super_intval_t,invariant,
                          (clock_reset_container_t *)&place_holder_clkreset);
        if (iVar7 == 0) {
          return 0x10;
        }
        if (place_holder_clkreset != DAT_002206e0) {
          __assert_fail("place_holder_clkreset.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                        ,0x56,
                        "tchecker::state_status_t tchecker::ta::final(const tchecker::ta::system_t &, const tchecker::vloc_sptr_t &, const tchecker::intval_sptr_t &, const tchecker::vedge_sptr_t &, tchecker::sync_id_t &, tchecker::clock_constraint_container_t &, const tchecker::ta::final_value_t &)"
                       );
        }
        lVar9 = lVar9 + 4;
      } while (uVar8 << 2 != lVar9);
      sVar6 = 1;
    }
  }
  return sVar6;
LAB_00179050:
  __function = 
  "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::intval_t>]"
  ;
LAB_00179065:
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,__function);
}

Assistant:

tchecker::state_status_t final(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                               tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                               tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & invariant,
                               tchecker::ta::final_value_t const & final_value)
{
  auto && [edges, valuation] = final_value;

  // compute vloc and vedge from final edges
  auto status = tchecker::syncprod::final(system.as_syncprod_system(), vloc, vedge, sync_id, edges);
  if (status != STATE_OK)
    return status;

  // compute intval
  auto const & intvars = system.integer_variables().flattened();
  tchecker::intvar_id_t intvars_size = intvars.size();
  tchecker::intvar_id_t id = 0;
  for (tchecker::integer_t v : valuation) {
    if (id >= intvars_size)
      throw std::runtime_error("tchecker::ta::final: valuation of incompatible size");
    (*intval)[id] = v;
    ++id;
  }

  // check invariant
  tchecker::vm_t & vm = system.vm();
  for (tchecker::loc_id_t loc_id : *vloc) {
    if (vm.run(system.invariant_bytecode(loc_id), *intval, invariant, place_holder_clkreset) == 0)
      return tchecker::STATE_INTVARS_TGT_INVARIANT_VIOLATED;
    assert(place_holder_clkreset.empty());
  }

  return tchecker::STATE_OK;
}